

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O3

void getopt_add_bool(getopt_t *gopt,char sopt,char *lname,int def,char *help)

{
  zarray_t *pzVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  zhash_t *pzVar5;
  char *pcVar6;
  _func_uint32_t_void_ptr *p_Var7;
  undefined4 in_register_0000000c;
  char *lname_00;
  char sopt_00;
  getopt_t *gopt_00;
  char *help_00;
  char sname [2];
  getopt_option_t *goo;
  char *sname_ptr;
  undefined1 local_4a [10];
  zhash_t *local_40;
  zarray_t *local_38;
  
  pcVar6 = (char *)CONCAT44(in_register_0000000c,def);
  local_38 = (zarray_t *)local_4a;
  local_4a[1] = 0;
  local_4a[0] = sopt;
  local_4a._2_8_ = lname;
  if (*lname == '\0') {
    getopt_add_bool_cold_4();
LAB_003c69a1:
    getopt_add_bool_cold_3();
  }
  else {
    if (sopt == '-') goto LAB_003c69a1;
    help_00 = help;
    iVar3 = zhash_contains(gopt->lopts,local_4a + 2);
    if (iVar3 == 0) {
      if ((sopt != '\0') && (iVar3 = zhash_contains(gopt->sopts,&local_38), iVar3 != 0)) {
        gopt_00 = (getopt_t *)(local_4a + 2);
        sopt_00 = (char)local_4a;
        getopt_add_bool_cold_2();
        getopt_add_string(gopt_00,sopt_00,lname_00,pcVar6,help_00);
        return;
      }
      pzVar5 = (zhash_t *)calloc(1,0x30);
      local_40 = pzVar5;
      pcVar6 = strdup(local_4a);
      pzVar5->keysz = (size_t)pcVar6;
      pcVar6 = strdup((char *)local_4a._2_8_);
      pzVar5->valuesz = (size_t)pcVar6;
      pcVar6 = "true";
      if (def == 0) {
        pcVar6 = "false";
      }
      pcVar6 = strdup(pcVar6);
      *(char **)&pzVar5->entrysz = pcVar6;
      *(undefined4 *)&pzVar5->equals = 1;
      p_Var7 = (_func_uint32_t_void_ptr *)strdup(help);
      pzVar5->hash = p_Var7;
      zhash_put(gopt->lopts,&pzVar5->valuesz,&local_40,(void *)0x0,(void *)0x0);
      zhash_put(gopt->sopts,local_40,&local_40,(void *)0x0,(void *)0x0);
      pzVar1 = gopt->options;
      if (pzVar1 != (zarray_t *)0x0) {
        iVar3 = pzVar1->size;
        iVar4 = pzVar1->alloc;
        if (iVar3 < iVar4) {
          pcVar6 = pzVar1->data;
        }
        else {
          do {
            bVar2 = iVar4 < 4;
            iVar4 = iVar4 * 2;
            if (bVar2) {
              iVar4 = 8;
            }
          } while (iVar4 <= iVar3);
          pzVar1->alloc = iVar4;
          pcVar6 = (char *)realloc(pzVar1->data,(long)iVar4 * pzVar1->el_sz);
          pzVar1->data = pcVar6;
          iVar3 = pzVar1->size;
        }
        memcpy(pcVar6 + (long)iVar3 * pzVar1->el_sz,&local_40,pzVar1->el_sz);
        pzVar1->size = pzVar1->size + 1;
        return;
      }
      goto LAB_003c69b0;
    }
  }
  getopt_add_bool_cold_1();
LAB_003c69b0:
  __assert_fail("za != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                ,0xb5,"void zarray_add(zarray_t *, const void *)");
}

Assistant:

void getopt_add_bool(getopt_t *gopt, char sopt, const char *lname, int def, const char *help)
{
    char sname[2];
    sname[0] = sopt;
    sname[1] = 0;
    char *sname_ptr = (char*) &sname;

    if (strlen(lname) < 1) { // must have long name
        fprintf (stderr, "getopt_add_bool(): must supply option name\n");
        exit (EXIT_FAILURE);
    }

    if (sopt == '-') { // short name cannot be '-' (no way to reference)
        fprintf (stderr, "getopt_add_bool(): invalid option character: '%c'\n", sopt);
        exit (EXIT_FAILURE);
    }

    if (zhash_contains(gopt->lopts, &lname)) {
        fprintf (stderr, "getopt_add_bool(): duplicate option name: --%s\n", lname);
        exit (EXIT_FAILURE);
    }

    if (sopt != '\0' && zhash_contains(gopt->sopts, &sname_ptr)) {
        fprintf (stderr, "getopt_add_bool(): duplicate option: -%s ('%s')\n", sname, lname);
        exit (EXIT_FAILURE);
    }

    getopt_option_t *goo = (getopt_option_t*) calloc(1, sizeof(getopt_option_t));
    goo->sname=strdup(sname);
    goo->lname=strdup(lname);
    goo->svalue=strdup(def ? "true" : "false");
    goo->type=GOO_BOOL_TYPE;
    goo->help=strdup(help);

    zhash_put(gopt->lopts, &goo->lname, &goo, NULL, NULL);
    zhash_put(gopt->sopts, &goo->sname, &goo, NULL, NULL);
    zarray_add(gopt->options, &goo);
}